

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O2

int __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
         *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  scgi *__p;
  context *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  shared_ptr<cppcms::impl::cgi::scgi> api;
  __shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = server_api_factory<cppcms::impl::cgi::scgi>::operator()
                  ((server_api_factory<cppcms::impl::cgi::scgi> *)(lVar1 + 100),
                   *(service **)(lVar1 + 8));
  std::__shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>::
  reset<cppcms::impl::cgi::scgi>
            (&api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>,__p);
  booster::aio::basic_io_device::assign
            ((int)api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x118);
  if (*(char *)(lVar1 + 0x59) != '\0') {
    booster::aio::basic_socket::set_option
              (&(api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->socket_,0,1);
  }
  this_00 = (context *)operator_new(0x28);
  std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::scgi,void>
            (local_30,&api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>);
  cppcms::http::context::context(this_00,(shared_ptr<cppcms::impl::cgi::connection> *)local_30);
  std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::context,void>
            ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&api.super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this;
}

Assistant:

virtual booster::shared_ptr< ::cppcms::http::context> accept(int fd)
			{
				booster::shared_ptr<ServerAPI> api;
				try {
					api.reset(factory_(srv_));
					api->socket_.assign(fd);
					fd=-1;
				}
				catch(...) {
					::close(fd);
					throw;
				}
				if(tcp_)
					api->socket_.set_option(io::basic_socket::tcp_no_delay,true);
				booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api));
				return cnt;
			}